

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_array_reverse(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue *pJVar1;
  JSValueUnion JVar2;
  int64_t iVar3;
  JSValue val;
  int iVar4;
  BOOL BVar5;
  int iVar6;
  JSValue *pJVar7;
  int64_t iVar8;
  long idx;
  ulong uVar9;
  long idx_00;
  JSValue obj;
  JSValue v;
  JSValue obj_00;
  JSValue JVar10;
  JSValueUnion local_68;
  int64_t iStack_60;
  uint32_t count32;
  int64_t len;
  JSValue *arrp;
  JSValue hval;
  
  local_68.int32 = 0;
  iStack_60 = 3;
  obj_00 = JS_ToObject(ctx,this_val);
  iVar4 = js_get_length64(ctx,&len,obj_00);
  iVar8 = 3;
  if (iVar4 == 0) {
    obj.tag = (int64_t)&arrp;
    obj.u = (JSValueUnion)(JSValueUnion)obj_00.tag;
    BVar5 = js_get_fast_array((JSContext *)obj_00.u.ptr,obj,(JSValue **)&count32,(uint32_t *)argv);
    if ((BVar5 == 0) || (len != (ulong)count32)) {
      idx_00 = len;
      for (idx = 0; idx_00 = idx_00 + -1, idx < idx_00; idx = idx + 1) {
        iVar4 = JS_TryGetPropertyInt64(ctx,obj_00,idx,(JSValue *)&local_68);
        iVar8 = iStack_60;
        if (iVar4 < 0) goto LAB_00154f71;
        iVar6 = JS_TryGetPropertyInt64(ctx,obj_00,idx_00,&hval);
        iVar8 = iStack_60;
        if (iVar6 < 0) goto LAB_00154f71;
        if (iVar6 == 0) {
          if (iVar4 != 0) {
            iVar4 = JS_DeletePropertyInt64(ctx,obj_00,idx,0x4000);
            iVar8 = iStack_60;
            if (-1 < iVar4) goto LAB_00154f24;
            goto LAB_00154f71;
          }
        }
        else {
          iVar6 = JS_SetPropertyInt64(ctx,obj_00,idx,hval);
          iVar8 = iStack_60;
          if (iVar6 < 0) goto LAB_00154f71;
          if (iVar4 == 0) {
            iVar4 = JS_DeletePropertyInt64(ctx,obj_00,idx_00,0x4000);
            iVar8 = iStack_60;
            if (iVar4 < 0) goto LAB_00154f71;
          }
          else {
LAB_00154f24:
            val.u._4_4_ = local_68._4_4_;
            val.u.int32 = local_68.int32;
            val.tag = iStack_60;
            iVar4 = JS_SetPropertyInt64(ctx,obj_00,idx_00,val);
            local_68.int32 = 0;
            if (iVar4 < 0) {
              iVar8 = 3;
              goto LAB_00154f71;
            }
            iStack_60 = 3;
          }
        }
      }
    }
    else if (1 < count32) {
      uVar9 = 0;
      pJVar1 = arrp + len;
      while( true ) {
        len = len - 1;
        pJVar7 = pJVar1 + -1;
        if ((ulong)len <= uVar9) break;
        JVar2 = arrp->u;
        iVar8 = arrp->tag;
        iVar3 = pJVar1[-1].tag;
        arrp->u = pJVar7->u;
        arrp->tag = iVar3;
        pJVar7->u = JVar2;
        pJVar1[-1].tag = iVar8;
        uVar9 = uVar9 + 1;
        arrp = arrp + 1;
        pJVar1 = pJVar7;
      }
    }
    uVar9 = (ulong)obj_00.u.ptr & 0xffffffff00000000;
  }
  else {
LAB_00154f71:
    v.u._4_4_ = local_68._4_4_;
    v.u.int32 = local_68.int32;
    v.tag = iVar8;
    JS_FreeValue(ctx,v);
    JS_FreeValue(ctx,obj_00);
    obj_00 = (JSValue)(ZEXT816(6) << 0x40);
    uVar9 = 0;
  }
  JVar10.u.ptr = (void *)((ulong)obj_00.u.ptr & 0xffffffff | uVar9);
  JVar10.tag = obj_00.tag;
  return JVar10;
}

Assistant:

static JSValue js_array_reverse(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv)
{
    JSValue obj, lval, hval;
    JSValue *arrp;
    int64_t len, l, h;
    int l_present, h_present;
    uint32_t count32;

    lval = JS_UNDEFINED;
    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &len, obj))
        goto exception;

    /* Special case fast arrays */
    if (js_get_fast_array(ctx, obj, &arrp, &count32) && count32 == len) {
        uint32_t ll, hh;

        if (count32 > 1) {
            for (ll = 0, hh = count32 - 1; ll < hh; ll++, hh--) {
                lval = arrp[ll];
                arrp[ll] = arrp[hh];
                arrp[hh] = lval;
            }
        }
        return obj;
    }

    for (l = 0, h = len - 1; l < h; l++, h--) {
        l_present = JS_TryGetPropertyInt64(ctx, obj, l, &lval);
        if (l_present < 0)
            goto exception;
        h_present = JS_TryGetPropertyInt64(ctx, obj, h, &hval);
        if (h_present < 0)
            goto exception;
        if (h_present) {
            if (JS_SetPropertyInt64(ctx, obj, l, hval) < 0)
                goto exception;

            if (l_present) {
                if (JS_SetPropertyInt64(ctx, obj, h, lval) < 0) {
                    lval = JS_UNDEFINED;
                    goto exception;
                }
                lval = JS_UNDEFINED;
            } else {
                if (JS_DeletePropertyInt64(ctx, obj, h, JS_PROP_THROW) < 0)
                    goto exception;
            }
        } else {
            if (l_present) {
                if (JS_DeletePropertyInt64(ctx, obj, l, JS_PROP_THROW) < 0)
                    goto exception;
                if (JS_SetPropertyInt64(ctx, obj, h, lval) < 0) {
                    lval = JS_UNDEFINED;
                    goto exception;
                }
                lval = JS_UNDEFINED;
            }
        }
    }
    return obj;

 exception:
    JS_FreeValue(ctx, lval);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}